

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::objectivec::FieldGenerator::SetRuntimeHasBit
          (FieldGenerator *this,int has_index)

{
  char *pcVar1;
  mapped_type *this_00;
  key_type local_88;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  char *local_48;
  long local_40;
  char local_38 [32];
  
  local_48 = local_38;
  pcVar1 = FastInt32ToBufferLeft(has_index,local_38);
  local_40 = (long)pcVar1 - (long)local_38;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,local_48,local_48 + local_40);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"has_index","");
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->variables_,&local_88);
  std::__cxx11::string::operator=((string *)this_00,(string *)local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  return;
}

Assistant:

void FieldGenerator::SetRuntimeHasBit(int has_index) {
  variables_["has_index"] = StrCat(has_index);
}